

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * ll_pop_back(ll_head *q_head,int wait)

{
  ll_elem *plVar1;
  size_t count;
  size_t count_00;
  size_t count_01;
  ll_head *q_head_00;
  ll_head *q_head_01;
  
  do {
    plVar1 = pred(q_head,&q_head->q);
    q_head_00 = (ll_head *)((ulong)plVar1 & 0xfffffffffffffffc);
    if (q_head_00 == q_head) {
      deref_release(q_head_00,(ll_elem *)0x1,count);
      return (ll_elem *)0x0;
    }
    do {
      plVar1 = ll_unlink(q_head,&q_head_00->q,wait);
      if (plVar1 != (ll_elem *)0x0) {
        return &q_head_00->q;
      }
      plVar1 = pred(q_head,&q_head_00->q);
      q_head_01 = (ll_head *)((ulong)plVar1 & 0xfffffffffffffffc);
      deref_release(q_head_00,(ll_elem *)0x1,count_00);
      q_head_00 = q_head_01;
    } while (q_head_01 != q_head);
    deref_release(q_head_01,(ll_elem *)0x1,count_01);
  } while( true );
}

Assistant:

struct ll_elem*
ll_pop_back(struct ll_head *q_head, int wait)
{
	struct ll_elem	*q, *n, *n_;

	q = &q_head->q;
	while ((n = ptr_clear(pred(q_head, q))) != q) {
		do {
			if (ll_unlink(q_head, n, wait))
				return n;
			n_ = n;
			n = ptr_clear(pred(q_head, n_));
			deref_release(q_head, n_, 1);
		} while (n != q);
		deref_release(q_head, n, 1);
	}
	deref_release(q_head, n, 1);
	return NULL;
}